

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<double> * __thiscall
Catch::Generators::makeGenerators<double,double>
          (Generators<double> *__return_storage_ptr__,Generators *this,double *val,
          double *moreGenerators)

{
  GeneratorWrapper<double> local_28;
  GeneratorWrapper<double> *local_20;
  double *moreGenerators_local;
  double *val_local;
  
  local_20 = (GeneratorWrapper<double> *)val;
  moreGenerators_local = (double *)this;
  val_local = (double *)__return_storage_ptr__;
  value<double>((Generators *)&local_28,(double *)this);
  makeGenerators<double,double>
            (__return_storage_ptr__,(Generators *)&local_28,local_20,moreGenerators);
  GeneratorWrapper<double>::~GeneratorWrapper(&local_28);
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }